

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

TokenOrSyntax * __thiscall
slang::syntax::DoWhileStatementSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,DoWhileStatementSyntax *this,size_t index)

{
  StatementSyntax *pSVar1;
  char *func;
  Token local_20;
  
  switch(index) {
  case 0:
    pSVar1 = (StatementSyntax *)(this->super_StatementSyntax).label;
    goto LAB_002a6bf4;
  case 1:
    *(SyntaxNode **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    goto LAB_002a6bf7;
  case 2:
    local_20.kind = (this->doKeyword).kind;
    local_20._2_1_ = (this->doKeyword).field_0x2;
    local_20.numFlags.raw = (this->doKeyword).numFlags.raw;
    local_20.rawLen = (this->doKeyword).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->doKeyword).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->doKeyword).info + 4);
    break;
  case 3:
    pSVar1 = (this->statement).ptr;
    if (pSVar1 == (StatementSyntax *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::StatementSyntax *>::get() const [T = slang::syntax::StatementSyntax *]"
      ;
LAB_002a6c3e:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,func);
    }
    goto LAB_002a6bf4;
  case 4:
    local_20.kind = (this->whileKeyword).kind;
    local_20._2_1_ = (this->whileKeyword).field_0x2;
    local_20.numFlags.raw = (this->whileKeyword).numFlags.raw;
    local_20.rawLen = (this->whileKeyword).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->whileKeyword).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->whileKeyword).info + 4);
    break;
  case 5:
    local_20.kind = (this->openParen).kind;
    local_20._2_1_ = (this->openParen).field_0x2;
    local_20.numFlags.raw = (this->openParen).numFlags.raw;
    local_20.rawLen = (this->openParen).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->openParen).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->openParen).info + 4);
    break;
  case 6:
    pSVar1 = (StatementSyntax *)(this->expr).ptr;
    if (pSVar1 == (StatementSyntax *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
      ;
      goto LAB_002a6c3e;
    }
LAB_002a6bf4:
    *(StatementSyntax **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pSVar1;
LAB_002a6bf7:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\x01';
    return __return_storage_ptr__;
  case 7:
    local_20.kind = (this->closeParen).kind;
    local_20._2_1_ = (this->closeParen).field_0x2;
    local_20.numFlags.raw = (this->closeParen).numFlags.raw;
    local_20.rawLen = (this->closeParen).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->closeParen).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->closeParen).info + 4);
    break;
  case 8:
    local_20.kind = (this->semi).kind;
    local_20._2_1_ = (this->semi).field_0x2;
    local_20.numFlags.raw = (this->semi).numFlags.raw;
    local_20.rawLen = (this->semi).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->semi).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->semi).info + 4);
    break;
  default:
    parsing::Token::Token(&local_20);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
       local_20._0_4_;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 4) =
       local_20.rawLen;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8) =
       local_20.info._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0xc) =
       local_20.info._4_4_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\0';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax DoWhileStatementSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return doKeyword;
        case 3: return statement.get();
        case 4: return whileKeyword;
        case 5: return openParen;
        case 6: return expr.get();
        case 7: return closeParen;
        case 8: return semi;
        default: return nullptr;
    }
}